

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sds.c
# Opt level: O3

int sdscmp(sds s1,sds s2)

{
  int iVar1;
  ulong __n;
  ulong uVar2;
  ulong uVar3;
  
  switch(s1[-1] & 7) {
  case 0:
    uVar2 = (ulong)((byte)s1[-1] >> 3);
    break;
  case 1:
    uVar2 = (ulong)(byte)s1[-3];
    break;
  case 2:
    uVar2 = (ulong)*(ushort *)(s1 + -5);
    break;
  case 3:
    uVar2 = (ulong)*(uint *)(s1 + -9);
    break;
  case 4:
    uVar2 = *(ulong *)(s1 + -0x11);
    break;
  default:
    uVar2 = 0;
  }
  switch(s2[-1] & 7) {
  case 0:
    uVar3 = (ulong)((byte)s2[-1] >> 3);
    break;
  case 1:
    uVar3 = (ulong)(byte)s2[-3];
    break;
  case 2:
    uVar3 = (ulong)*(ushort *)(s2 + -5);
    break;
  case 3:
    uVar3 = (ulong)*(uint *)(s2 + -9);
    break;
  case 4:
    uVar3 = *(ulong *)(s2 + -0x11);
    break;
  default:
    uVar3 = 0;
  }
  __n = uVar3;
  if (uVar2 < uVar3) {
    __n = uVar2;
  }
  iVar1 = memcmp(s1,s2,__n);
  if (iVar1 == 0) {
    iVar1 = (int)uVar2 - (int)uVar3;
  }
  return iVar1;
}

Assistant:

int sdscmp(const sds s1, const sds s2) {
    size_t l1, l2, minlen;
    int cmp;

    l1 = sdslen(s1);
    l2 = sdslen(s2);
    minlen = (l1 < l2) ? l1 : l2;
    cmp = memcmp(s1,s2,minlen);
    if (cmp == 0) return l1-l2;
    return cmp;
}